

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio_impl.cpp
# Opt level: O2

void __thiscall ui::GPIOImpl::BuildUI(GPIOImpl *this)

{
  int *selected;
  ComponentBase *this_00;
  string *psVar1;
  long lVar2;
  ConstStringListRef entries;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  string gpio_path;
  directory_iterator local_3c8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *local_3b0;
  int *local_3a8;
  int *local_3a0;
  directory_iterator __end2;
  Component local_370;
  Component local_360;
  int *local_350;
  int *local_348;
  shared_ptr<ui::Gpio> gpio;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_330;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_320;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_308;
  Components local_2f8;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  int *local_2c8 [4];
  MenuOption local_2a8;
  MenuOption menuOpt;
  Ref<ftxui::MenuOption> local_108;
  
  ftxui::MenuOption::MenuOption(&menuOpt);
  gpio_path._M_dataplus._M_p = (pointer)this;
  std::function<void()>::operator=
            ((function<void()> *)&menuOpt.on_enter,(anon_class_8_1_8991fb9c *)&gpio_path);
  ftxui::MenuOption::MenuOption(&local_2a8,&menuOpt);
  ftxui::Ref<ftxui::MenuOption>::Ref(&local_108,&local_2a8);
  selected = &this->selected;
  entries.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)0x0;
  entries.ref_ = &this->gpio_names;
  ftxui::Menu((ftxui *)&gpio_path,entries,selected,&local_108);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->gpio_menu).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)&gpio_path);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gpio_path._M_string_length);
  ftxui::MenuOption::~MenuOption(&local_108.owned_);
  ftxui::MenuOption::~MenuOption(&local_2a8);
  local_2f8.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ftxui::Container::Vertical((Container *)&gpio_path,&local_2f8,selected);
  local_3b0 = &(this->gpio_individual).
               super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
            (local_3b0,(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)&gpio_path)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gpio_path._M_string_length);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_2f8);
  std::filesystem::__cxx11::path::path<char[17],std::filesystem::__cxx11::path>
            ((path *)&gpio_path,(char (*) [17])"/sys/class/gpio/",auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_330,(path *)&gpio_path);
  std::filesystem::__cxx11::path::~path((path *)&gpio_path);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_308,&local_330);
  local_3c8._M_dir._M_ptr = local_308._M_ptr;
  local_3c8._M_dir._M_refcount._M_pi = local_308._M_refcount._M_pi;
  local_308._M_ptr = (element_type *)0x0;
  local_308._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_308._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2d8,&local_330);
  __end2._M_dir._M_ptr = (element_type *)0x0;
  __end2._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d8._M_refcount);
  local_3a8 = &this->tab;
  local_3a0 = &this->limit;
  while (local_3c8._M_dir._M_refcount._M_pi != __end2._M_dir._M_refcount._M_pi) {
    psVar1 = (string *)std::filesystem::__cxx11::directory_iterator::operator*(&local_3c8);
    std::__cxx11::string::string((string *)&gpio_path,psVar1);
    lVar2 = std::__cxx11::string::find((char *)&gpio_path,0x1463b6);
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find((char *)&gpio_path,0x1463bf);
      if (lVar2 != -1) {
        local_2c8[0] = local_3a8;
        local_350 = local_3a0;
        local_348 = selected;
        std::make_shared<ui::Gpio,std::__cxx11::string&,int*,int*,int*>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gpio,
                   (int **)&gpio_path,local_2c8,&local_348);
        std::__cxx11::string::string
                  ((string *)local_2c8,
                   (string *)
                   &(gpio.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->label_);
        lVar2 = std::__cxx11::string::find((char *)local_2c8,0x1490fc);
        std::__cxx11::string::~string((string *)local_2c8);
        if (lVar2 != -1) {
          std::vector<std::shared_ptr<ui::Gpio>,_std::allocator<std::shared_ptr<ui::Gpio>_>_>::
          push_back(&this->children_,(value_type *)&gpio);
          this_00 = ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
                    &local_3b0->_M_ptr)->_M_ptr;
          std::__shared_ptr<ftxui::ComponentBase,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<ui::Gpio,void>
                    ((__shared_ptr<ftxui::ComponentBase,(__gnu_cxx::_Lock_policy)2> *)&local_360,
                     (__shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2> *)&gpio);
          ftxui::ComponentBase::Add(this_00,&local_360);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_360.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          *local_3a0 = *local_3a0 + 1;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&gpio.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    std::__cxx11::string::~string((string *)&gpio_path);
    std::filesystem::__cxx11::directory_iterator::operator++(&local_3c8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end2._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c8._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_330._M_refcount);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)&gpio_path,
             &(this->gpio_menu).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)&gpio_path.field_2,
             local_3b0);
  __l._M_len = 2;
  __l._M_array = (iterator)&gpio_path;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_320,__l,(allocator_type *)local_2c8);
  ftxui::Container::Tab((Container *)&local_370,&local_320,local_3a8);
  ftxui::ComponentBase::Add((ComponentBase *)this,&local_370);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_370.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_320);
  lVar2 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&gpio_path._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -8);
  ftxui::MenuOption::~MenuOption(&menuOpt);
  return;
}

Assistant:

void BuildUI() {
    MenuOption menuOpt;
    menuOpt.on_enter = [&] { tab = 1; };
    gpio_menu = Menu(&gpio_names, &selected, menuOpt);
    gpio_individual = Container::Vertical({}, &selected);
    for (const auto& it :
         std::filesystem::directory_iterator("/sys/class/gpio/")) {
      std::string gpio_path = it.path();
      if (gpio_path.find("gpiochip") == std::string::npos &&
          gpio_path.find("gpio") != std::string::npos) {
        auto gpio = std::make_shared<Gpio>(gpio_path, &tab, &selected, &limit);
        if (gpio->label().find("P") != std::string::npos) {
          children_.push_back(gpio);
          gpio_individual->Add(gpio);
          limit++;
        }
      }
    }

    Add(Container::Tab(
        {
            gpio_menu,
            gpio_individual,
        },
        &tab));
  }